

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O2

void linker_mapfile(GlobalVars *gv)

{
  node *__s1;
  int iVar1;
  bool bVar2;
  FILE *__s;
  node *pnVar3;
  node *pnVar4;
  node *pnVar5;
  char *__ptr;
  undefined8 uVar6;
  node *pnVar7;
  size_t sStack_40;
  
  if ((FILE *)gv->map_file != (FILE *)0x0) {
    fwrite("\nFiles:\n",8,1,(FILE *)gv->map_file);
    pnVar5 = (node *)&gv->selobjects;
    pnVar4 = (node *)&gv->lnksec;
    while (pnVar5 = pnVar5->next, pnVar5->next != (node *)0x0) {
      if (-1 < *(short *)&pnVar5[8].next) {
        pnVar7 = pnVar5[1].next;
        if (*(undefined1 *)((long)&pnVar7[3].pred + 1) == '\b') {
          fprintf((FILE *)gv->map_file,"  %s (%s):",pnVar7[1].next,pnVar5[1].pred);
        }
        else {
          fprintf((FILE *)gv->map_file,"  %s:",pnVar5[1].pred);
        }
        if (*(undefined1 *)((long)&pnVar7[3].pred + 1) == '\x04') {
LAB_0010d12f:
          __s = (FILE *)gv->map_file;
          __ptr = "  symbols only\n";
          sStack_40 = 0xf;
        }
        else {
          uVar6 = 0x20;
          pnVar7 = pnVar4;
          while (pnVar7 = pnVar7->next, pnVar7->next != (node *)0x0) {
            pnVar3 = (node *)&pnVar7[6].pred;
            while (pnVar3 = pnVar3->next, pnVar3->next != (node *)0x0) {
              if (pnVar3[1].next == pnVar5) {
                __s1 = pnVar3[2].next;
                iVar1 = strcmp((char *)__s1,gv->common_sec_name);
                if ((iVar1 != 0) && (iVar1 = strcmp((char *)__s1,gv->scommon_sec_name), iVar1 != 0))
                {
                  fprintf((FILE *)gv->map_file,"%c %s %lx(%lx)",uVar6,__s1,pnVar3[3].pred,
                          pnVar3[5].next);
                  uVar6 = 0x2c;
                }
              }
            }
          }
          if ((char)uVar6 != ',') goto LAB_0010d12f;
          __s = (FILE *)gv->map_file;
          __ptr = " hex\n";
          sStack_40 = 5;
        }
        fwrite(__ptr,sStack_40,1,__s);
      }
    }
    fwrite("\n\nSection mapping (numbers in hex):\n",0x24,1,(FILE *)gv->map_file);
    while (pnVar4 = pnVar4->next, pnVar4->next != (node *)0x0) {
      if ((((pnVar4[5].next != (node *)0x0) || ((pnVar4[8].pred)->next != (node *)0x0)) ||
          ((pnVar4[0xb].pred)->next != (node *)0x0)) || (((ulong)pnVar4[2].pred & 2) != 0)) {
        fprintf((FILE *)gv->map_file,"------------------------------\n  %08lx %s  (size %lx",
                pnVar4[4].next,pnVar4[1].pred);
        if (pnVar4[5].pred < pnVar4[5].next) {
          fprintf((FILE *)gv->map_file,", allocated %lx");
        }
        fwrite(")\n",2,1,(FILE *)gv->map_file);
        pnVar5 = (node *)&pnVar4[6].pred;
        while (pnVar5 = pnVar5->next, pnVar5->next != (node *)0x0) {
          if (((ObjectUnit *)pnVar5[1].next != (ObjectUnit *)0x0) &&
             (bVar2 = is_ld_script((ObjectUnit *)pnVar5[1].next), bVar2 == 0)) {
            fprintf((FILE *)gv->map_file,"           %08lx - %08lx %s(%s)\n",pnVar5[3].pred,
                    (long)&(pnVar5[3].pred)->next + (long)pnVar5[5].next,pnVar5[1].next[1].pred,
                    pnVar5[2].next);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void linker_mapfile(struct GlobalVars *gv)
/* print section mapping, when desired */
{
  if (gv->map_file) {
    struct ObjectUnit *obj;
    struct Section *sec;
    struct LinkedSection *ls;

    /* print file names and the new addresses of their sections */
    fprintf(gv->map_file,"\nFiles:\n");

    for (obj=(struct ObjectUnit *)gv->selobjects.first;
         obj->n.next!=NULL; obj=(struct ObjectUnit *)obj->n.next) {
      struct LinkFile *lfile = obj->lnkfile;
      char sep = ' ';

      if (!(obj->flags & OUF_SCRIPT)) {
        if (lfile->type == ID_LIBARCH)
          fprintf(gv->map_file,"  %s (%s):",lfile->pathname,obj->objname);
        else
          fprintf(gv->map_file,"  %s:",obj->objname);

        if (lfile->type != ID_SHAREDOBJ) {
          for (ls=(struct LinkedSection *)gv->lnksec.first;
               ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
            for (sec=(struct Section *)ls->sections.first;
                 sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
              if (sec->obj == obj) {  /* section came from this object? */
                if (strcmp(sec->name,gv->common_sec_name) &&
                    strcmp(sec->name,gv->scommon_sec_name)) {
                  fprintf(gv->map_file,"%c %s %lx(%lx)",sep,sec->name,
                          sec->va,sec->size);
                  sep = ',';
                }
              }
            }
          }
        }

        if (sep == ',')  /* any sections listed? */
          fprintf(gv->map_file," hex\n");
        else
          fprintf(gv->map_file,"  symbols only\n"); /* empty or shared obj. */
      }
    }

    /* print section mappings */
    fprintf(gv->map_file,"\n\nSection mapping (numbers in hex):\n");

    for (ls=(struct LinkedSection *)gv->lnksec.first;
         ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
      if (!(ls->size==0 && listempty(&ls->relocs) &&
            listempty(&ls->symbols) && !(ls->ld_flags & LSF_PRESERVE))) {
        fprintf(gv->map_file,"------------------------------\n"
                "  %08lx %s  (size %lx",ls->copybase,ls->name,ls->size);
        if (ls->filesize < ls->size)
          fprintf(gv->map_file,", allocated %lx",ls->filesize);
        fprintf(gv->map_file,")\n");
  
        for (sec=(struct Section *)ls->sections.first;
             sec->n.next!=NULL; sec=(struct Section *)sec->n.next) {
          if (sec->obj!=NULL && !is_ld_script(sec->obj)) {
            fprintf(gv->map_file,"           %08lx - %08lx %s(%s)\n",
                    sec->va,sec->va+sec->size,sec->obj->objname,sec->name);
          }
        }
      }
    }
  }
}